

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall HashUtil_Sha256String_Test::TestBody(HashUtil_Sha256String_Test *this)

{
  undefined **ppuVar1;
  bool bVar2;
  HashUtil *this_00;
  char *pcVar3;
  AssertionResult gtest_ar;
  ByteData byte_data2;
  ByteData256 byte_data;
  undefined1 local_b8 [32];
  pointer local_98;
  string local_90;
  undefined1 local_70 [32];
  ByteData local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  long local_28;
  
  ppuVar1 = (undefined **)(local_b8 + 0x10);
  local_b8._0_8_ = ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"test Sha256 OK","");
  cfd::core::HashUtil::Sha256((ByteData256 *)&local_38,(string *)local_b8);
  if ((undefined **)local_b8._0_8_ != ppuVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_b8,(ByteData256 *)&local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_90,"byte_data.GetHex().c_str()",
             "\"98478d92e5005d232ad06c805eccf5381f47f6f51ee7803e5206dc04e2639a62\"",
             (char *)local_b8._0_8_,
             "98478d92e5005d232ad06c805eccf5381f47f6f51ee7803e5206dc04e2639a62");
  if ((undefined **)local_b8._0_8_ != ppuVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x94,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if ((undefined **)local_b8._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_b8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_b8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Sha256","");
  cfd::core::HashUtil::HashUtil((HashUtil *)local_b8,&local_90);
  local_70._0_8_ = (AssertHelperData *)(local_70 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"test Sha256 OK","");
  this_00 = cfd::core::HashUtil::operator<<((HashUtil *)local_b8,(string *)local_70);
  cfd::core::HashUtil::Output(&local_50,this_00);
  if ((AssertHelperData *)local_70._0_8_ != (AssertHelperData *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_b8._0_8_ = &PTR__HashUtil_007d6c28;
  if ((void *)local_b8._16_8_ != (void *)0x0) {
    operator_delete((void *)local_b8._16_8_,(long)local_98 - local_b8._16_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b8,&local_50);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_90,"byte_data2.GetHex().c_str()",
             "\"98478d92e5005d232ad06c805eccf5381f47f6f51ee7803e5206dc04e2639a62\"",
             (char *)local_b8._0_8_,
             "98478d92e5005d232ad06c805eccf5381f47f6f51ee7803e5206dc04e2639a62");
  if ((undefined **)local_b8._0_8_ != ppuVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_b8);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if ((undefined **)local_b8._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_b8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_b8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((void *)local_38._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_38._M_allocated_capacity,local_28 - local_38._0_8_);
  }
  return;
}

Assistant:

TEST(HashUtil, Sha256BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2213d0c45bf1ece1a9b0c2d5a21d603601e88e22ae2786fe3f0060ee4aad321d");
}